

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

void __thiscall
boost::runtime::cla::parser::help
          (parser *this,ostream *ostr,parameters_store *parameters,cstring *param_name)

{
  undefined8 uVar1;
  bool bVar2;
  type pbVar3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  ulong uVar5;
  ostream *poVar6;
  storage_type *psVar7;
  storage_type *psVar8;
  basic_cstring<const_char> *in_RCX;
  parameters_store *in_RDX;
  ostream *in_RSI;
  long in_RDI;
  basic_param_ptr local_resb0;
  value_type *v;
  bool _fe_con_334;
  static_any_t _fe_end_334;
  static_any_t _fe_cur_334;
  basic_param_ptr param;
  cstring *in_stack_00000548;
  cstring *in_stack_00000550;
  trie_ptr *in_stack_00000558;
  parser *in_stack_00000560;
  sp_counted_base *in_stack_fffffffffffffe08;
  pair<boost::runtime::parameter_cla_id,_boost::shared_ptr<boost::runtime::basic_param>_>
  *in_stack_fffffffffffffe10;
  std_string *in_stack_fffffffffffffe18;
  std_string *s;
  basic_cstring<const_char> *in_stack_fffffffffffffe20;
  pointer in_stack_fffffffffffffe28;
  basic_cstring<const_char> *in_stack_fffffffffffffe30;
  sp_counted_base *psVar9;
  key_type *in_stack_fffffffffffffe48;
  static_any_base *psVar10;
  map<boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>_>
  *in_stack_fffffffffffffe50;
  byte local_1a1;
  basic_cstring<const_char> *in_stack_fffffffffffffe68;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_fffffffffffffe70;
  undefined1 local_158 [16];
  std_string local_148;
  byte local_124;
  _Rb_tree_const_iterator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::basic_param>_>_>
  local_120;
  static_any_base *local_118;
  undefined1 local_108 [16];
  undefined1 local_f8 [48];
  basic_cstring<const_char> local_c8 [11];
  parameters_store *local_18;
  ostream *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  bVar2 = unit_test::basic_cstring<const_char>::is_empty(in_RCX);
  if (bVar2) {
    std::operator<<(local_10,"Usage: ");
    pbVar4 = unit_test::operator<<(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    std::operator<<(pbVar4," [Boost.Test argument]... ");
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      poVar6 = std::operator<<(local_10,(string *)(in_RDI + 0x10));
      std::operator<<(poVar6," [custom test module argument]...");
    }
    std::operator<<(local_10,
                    "\n\nBoost.Test arguments correspond to parameters listed below. All parameters are optional. You can use specify parameter value either as a command line argument or as a value of corresponding environment variable. In case if argument for the same parameter is specified in both places, command line is taking precedence. Command line argument format supports parameter name guessing, so you can use any unambiguous prefix to identify a parameter."
                   );
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      poVar6 = std::operator<<(local_10," All the arguments after the ");
      poVar6 = std::operator<<(poVar6,(string *)(in_RDI + 0x10));
      std::operator<<(poVar6," are ignored by the Boost.Test.");
    }
    std::operator<<(local_10,"\n\nBoost.Test supports following parameters:\n");
    psVar7 = parameters_store::all(local_18);
    psVar8 = parameters_store::all(local_18);
    unit_test::for_each::
    is_const_coll<std::map<boost::unit_test::basic_cstring<char_const>,boost::shared_ptr<boost::runtime::basic_param>,boost::runtime::parameters_store::lg_compare,std::allocator<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::shared_ptr<boost::runtime::basic_param>>>>const>
              (psVar8);
    integral_constant::operator_cast_to_bool__((integral_constant<bool,_true> *)0x246321);
    local_108._0_8_ =
         unit_test::for_each::
         begin<std::map<boost::unit_test::basic_cstring<char_const>,boost::shared_ptr<boost::runtime::basic_param>,boost::runtime::parameters_store::lg_compare,std::allocator<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::shared_ptr<boost::runtime::basic_param>>>>>
                   (psVar7);
    local_108._8_8_ = local_108;
    bVar2 = unit_test::for_each::static_any_base::operator_cast_to_bool
                      ((static_any_base *)local_108._8_8_);
    if (!bVar2) {
      psVar7 = parameters_store::all(local_18);
      psVar8 = parameters_store::all(local_18);
      unit_test::for_each::
      is_const_coll<std::map<boost::unit_test::basic_cstring<char_const>,boost::shared_ptr<boost::runtime::basic_param>,boost::runtime::parameters_store::lg_compare,std::allocator<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::shared_ptr<boost::runtime::basic_param>>>>const>
                (psVar8);
      integral_constant::operator_cast_to_bool__((integral_constant<bool,_true> *)0x24638f);
      local_120._M_node =
           (_Base_ptr)
           unit_test::for_each::
           end<std::map<boost::unit_test::basic_cstring<char_const>,boost::shared_ptr<boost::runtime::basic_param>,boost::runtime::parameters_store::lg_compare,std::allocator<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::shared_ptr<boost::runtime::basic_param>>>>>
                     (psVar7);
      local_118 = (static_any_base *)&local_120;
      bVar2 = unit_test::for_each::static_any_base::operator_cast_to_bool(local_118);
      if (!bVar2) {
        local_124 = 1;
        while( true ) {
          uVar1 = local_108._8_8_;
          local_1a1 = 0;
          if ((local_124 & 1) != 0) {
            psVar10 = local_118;
            psVar7 = parameters_store::all(local_18);
            psVar8 = parameters_store::all(local_18);
            unit_test::for_each::
            is_const_coll<std::map<boost::unit_test::basic_cstring<char_const>,boost::shared_ptr<boost::runtime::basic_param>,boost::runtime::parameters_store::lg_compare,std::allocator<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::shared_ptr<boost::runtime::basic_param>>>>const>
                      (psVar8);
            integral_constant::operator_cast_to_bool__((integral_constant<bool,_true> *)0x24642f);
            bVar2 = unit_test::for_each::
                    done<std::map<boost::unit_test::basic_cstring<char_const>,boost::shared_ptr<boost::runtime::basic_param>,boost::runtime::parameters_store::lg_compare,std::allocator<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::shared_ptr<boost::runtime::basic_param>>>>>
                              (uVar1,psVar10,psVar7);
            local_1a1 = bVar2 ^ 0xff;
          }
          if ((local_1a1 & 1) == 0) break;
          local_124 = 0;
          psVar9 = (sp_counted_base *)local_108._8_8_;
          psVar7 = parameters_store::all(local_18);
          psVar8 = parameters_store::all(local_18);
          unit_test::for_each::
          is_const_coll<std::map<boost::unit_test::basic_cstring<char_const>,boost::shared_ptr<boost::runtime::basic_param>,boost::runtime::parameters_store::lg_compare,std::allocator<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::shared_ptr<boost::runtime::basic_param>>>>const>
                    (psVar8);
          integral_constant::operator_cast_to_bool__((integral_constant<bool,_true> *)0x2464ac);
          local_148.field_2._8_8_ =
               unit_test::for_each::
               deref<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::shared_ptr<boost::runtime::basic_param>>const&,std::map<boost::unit_test::basic_cstring<char_const>,boost::shared_ptr<boost::runtime::basic_param>,boost::runtime::parameters_store::lg_compare,std::allocator<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::shared_ptr<boost::runtime::basic_param>>>>>
                         (psVar9,psVar7);
          while (((local_124 ^ 0xff) & 1) != 0) {
            s = &local_148;
            shared_ptr<boost::runtime::basic_param>::shared_ptr
                      ((shared_ptr<boost::runtime::basic_param> *)in_stack_fffffffffffffe10,
                       (shared_ptr<boost::runtime::basic_param> *)in_stack_fffffffffffffe08);
            pbVar3 = shared_ptr<boost::runtime::basic_param>::operator->
                               ((shared_ptr<boost::runtime::basic_param> *)in_stack_fffffffffffffe10
                               );
            poVar6 = local_10;
            unit_test::basic_cstring<const_char>::basic_cstring
                      ((basic_cstring<const_char> *)pbVar3,s);
            (*pbVar3->_vptr_basic_param[5])(pbVar3,poVar6,local_158);
            shared_ptr<boost::runtime::basic_param>::~shared_ptr
                      ((shared_ptr<boost::runtime::basic_param> *)0x246554);
            local_124 = 1;
          }
          if ((local_124 & 1) == 0) {
            parameters_store::all(local_18);
          }
          else {
            in_stack_fffffffffffffe08 = (sp_counted_base *)local_108._8_8_;
            in_stack_fffffffffffffe10 =
                 (pair<boost::runtime::parameter_cla_id,_boost::shared_ptr<boost::runtime::basic_param>_>
                  *)parameters_store::all(local_18);
            psVar7 = parameters_store::all(local_18);
            unit_test::for_each::
            is_const_coll<std::map<boost::unit_test::basic_cstring<char_const>,boost::shared_ptr<boost::runtime::basic_param>,boost::runtime::parameters_store::lg_compare,std::allocator<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::shared_ptr<boost::runtime::basic_param>>>>const>
                      (psVar7);
            integral_constant::operator_cast_to_bool__((integral_constant<bool,_true> *)0x2465d5);
            unit_test::for_each::
            next<std::map<boost::unit_test::basic_cstring<char_const>,boost::shared_ptr<boost::runtime::basic_param>,boost::runtime::parameters_store::lg_compare,std::allocator<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::shared_ptr<boost::runtime::basic_param>>>>>
                      (in_stack_fffffffffffffe08,in_stack_fffffffffffffe10);
          }
        }
      }
    }
    std::operator<<(local_10,
                    "\nUse --help=<parameter name> to display detailed help for specific parameter.\n"
                   );
  }
  else {
    std::
    map<boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>_>
    ::operator[](in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::shared_ptr
              ((shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *)
               in_stack_fffffffffffffe10,
               (shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *)
               in_stack_fffffffffffffe08);
    unit_test::basic_cstring<const_char>::basic_cstring(local_c8,in_RCX);
    unit_test::basic_cstring<const_char>::basic_cstring
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    locate_parameter(in_stack_00000560,in_stack_00000558,in_stack_00000550,in_stack_00000548);
    shared_ptr<boost::runtime::basic_param>::shared_ptr
              ((shared_ptr<boost::runtime::basic_param> *)in_stack_fffffffffffffe10,
               (shared_ptr<boost::runtime::basic_param> *)in_stack_fffffffffffffe08);
    std::pair<boost::runtime::parameter_cla_id,_boost::shared_ptr<boost::runtime::basic_param>_>::
    ~pair(in_stack_fffffffffffffe10);
    shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::~shared_ptr
              ((shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *)0x246157);
    pbVar3 = shared_ptr<boost::runtime::basic_param>::operator->
                       ((shared_ptr<boost::runtime::basic_param> *)in_stack_fffffffffffffe10);
    unit_test::basic_cstring<const_char>::basic_cstring
              (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    (*pbVar3->_vptr_basic_param[6])(pbVar3,local_10,local_f8);
    shared_ptr<boost::runtime::basic_param>::~shared_ptr
              ((shared_ptr<boost::runtime::basic_param> *)0x2461b8);
  }
  return;
}

Assistant:

void
    help( std::ostream& ostr, parameters_store const& parameters, cstring param_name )
    {
        if( !param_name.is_empty() ) {
            basic_param_ptr param = locate_parameter( m_param_trie[help_prefix], param_name, "" ).second;
            param->help( ostr, m_negation_prefix );
            return;
        }

        ostr << "Usage: " << m_program_name << " [Boost.Test argument]... ";
        if( !m_end_of_param_indicator.empty() )
            ostr << m_end_of_param_indicator << " [custom test module argument]...";

        ostr << "\n\nBoost.Test arguments correspond to parameters listed below. "
                "All parameters are optional. You can use specify parameter value either "
                "as a command line argument or as a value of corresponding environment "
                "variable. In case if argument for the same parameter is specified in both "
                "places, command line is taking precedence. Command line argument format "
                "supports parameter name guessing, so you can use any unambiguous "
                "prefix to identify a parameter.";
        if( !m_end_of_param_indicator.empty() )
            ostr << " All the arguments after the " << m_end_of_param_indicator << " are ignored by the Boost.Test.";

        ostr << "\n\nBoost.Test supports following parameters:\n";

        BOOST_TEST_FOREACH( parameters_store::storage_type::value_type const&, v, parameters.all() ) {
            basic_param_ptr param = v.second;

            param->usage( ostr, m_negation_prefix );
        }

        ostr << "\nUse --help=<parameter name> to display detailed help for specific parameter.\n";
    }